

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O1

text * __thiscall lest::env::context_abi_cxx11_(text *__return_storage_ptr__,env *this)

{
  size_type sVar1;
  long *plVar2;
  ulong *puVar3;
  ulong *local_58;
  ulong local_48;
  long lStack_40;
  text local_38;
  
  sections_abi_cxx11_(&local_38,this);
  plVar2 = (long *)std::__cxx11::string::replace
                             ((ulong)&local_38,0,(char *)0x0,(ulong)(this->testing)._M_dataplus._M_p
                             );
  puVar3 = (ulong *)(plVar2 + 2);
  if ((ulong *)*plVar2 == puVar3) {
    local_48 = *puVar3;
    lStack_40 = plVar2[3];
    local_58 = &local_48;
  }
  else {
    local_48 = *puVar3;
    local_58 = (ulong *)*plVar2;
  }
  sVar1 = plVar2[1];
  *plVar2 = (long)puVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  if (local_58 == &local_48) {
    (__return_storage_ptr__->field_2)._M_allocated_capacity = local_48;
    *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lStack_40;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_58;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = local_48;
  }
  __return_storage_ptr__->_M_string_length = sVar1;
  local_48 = local_48 & 0xffffffffffffff00;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

text context() { return testing + sections(); }